

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

node_t_conflict
find_def(c2m_ctx_t c2m_ctx,symbol_mode mode,node_t_conflict id,node_t_conflict scope,
        node_t_conflict *aux_node)

{
  int iVar1;
  symbol_t sym;
  symbol_t local_60;
  
  while( true ) {
    iVar1 = symbol_find(c2m_ctx,mode,id,scope,&local_60);
    if (iVar1 != 0) {
      if (aux_node != (node_t_conflict *)0x0) {
        *aux_node = local_60.aux_node;
      }
      return local_60.def_node;
    }
    if (scope == (node_t_conflict)0x0) break;
    scope = *(node_t_conflict *)((long)scope->attr + 0x20);
  }
  return (node_t_conflict)0x0;
}

Assistant:

static node_t find_def (c2m_ctx_t c2m_ctx, enum symbol_mode mode, node_t id, node_t scope,
                        node_t *aux_node) {
  symbol_t sym;

  for (;;) {
    if (!symbol_find (c2m_ctx, mode, id, scope, &sym)) {
      if (scope == NULL) return NULL;
      scope = ((struct node_scope *) scope->attr)->scope;
    } else {
      if (aux_node) *aux_node = sym.aux_node;
      return sym.def_node;
    }
  }
}